

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

int4 __thiscall EmitXml::beginFunction(EmitXml *this,Funcdata *fd)

{
  ostream *poVar1;
  Funcdata *fd_local;
  EmitXml *this_local;
  
  poVar1 = std::operator<<(this->s,"<function ");
  std::operator<<(poVar1,highlight[8]);
  std::operator<<(this->s,'>');
  return 0;
}

Assistant:

int4 EmitXml::beginFunction(const Funcdata *fd) {
  *s << "<function " << highlight[(int4)no_color];
  *s << '>';
  return 0;
}